

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
(anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,void *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bt)

{
  JBTIndex bt_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_20;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bt_local;
  Target *this_local;
  
  local_20 = bt;
  bt_local = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )this;
  this_local = (Target *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_40,(string *)bt);
  bt_00 = anon_unknown.dwarf_1207e7f::BacktraceData::Add
                    ((BacktraceData *)((long)this + 0x68),&local_20->Backtrace);
  anon_unknown.dwarf_1207e7f::
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::JBT
            (__return_storage_ptr__,&local_40,bt_00);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

JBT<T> ToJBT(BT<T> const& bt)
  {
    return JBT<T>(bt.Value, this->Backtraces.Add(bt.Backtrace));
  }